

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  uint64_t *puVar1;
  secp256k1_strauss_point_state *psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  secp256k1_gej *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_scalar *a_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *a_02;
  secp256k1_scalar *a_03;
  secp256k1_gej *r_00;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  ulong uVar15;
  ulong extraout_RDX_01;
  secp256k1_ge *a_04;
  secp256k1_ge *a_05;
  uint uVar16;
  long lVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_gej *a_06;
  long lVar20;
  secp256k1_gej *psVar21;
  uint64_t uVar22;
  undefined8 *puVar23;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  secp256k1_ge *psVar27;
  secp256k1_fe *psVar28;
  secp256k1_gej *psVar29;
  secp256k1_gej *psVar30;
  secp256k1_fe *psVar31;
  byte bVar32;
  secp256k1_scalar na_lam;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  secp256k1_fe Z;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_fe sStack_b30;
  secp256k1_fe sStack_b00;
  secp256k1_gej *psStack_ad0;
  secp256k1_gej *psStack_ac8;
  secp256k1_fe *psStack_ac0;
  secp256k1_gej *psStack_ab8;
  secp256k1_gej *psStack_ab0;
  secp256k1_fe *psStack_aa0;
  undefined1 auStack_a98 [56];
  uint64_t uStack_a60;
  uint64_t uStack_a58;
  uint64_t uStack_a50;
  ulong uStack_a48;
  ulong uStack_a40;
  undefined1 auStack_a38 [56];
  uint64_t uStack_a00;
  uint64_t uStack_9f8;
  uint64_t uStack_9f0;
  ulong uStack_9e8;
  ulong uStack_9e0;
  undefined1 auStack_9d8 [56];
  uint64_t uStack_9a0;
  uint64_t uStack_998;
  uint64_t uStack_990;
  uint64_t uStack_988;
  int iStack_980;
  secp256k1_fe sStack_978;
  secp256k1_fe sStack_948;
  secp256k1_fe sStack_918;
  secp256k1_fe sStack_8e8;
  undefined1 auStack_8b8 [96];
  code *pcStack_858;
  secp256k1_gej *psStack_848;
  secp256k1_gej *psStack_840;
  secp256k1_gej *psStack_838;
  undefined1 *puStack_830;
  secp256k1_gej sStack_828;
  secp256k1_gej *psStack_790;
  secp256k1_gej *psStack_788;
  secp256k1_gej *psStack_780;
  secp256k1_gej *psStack_778;
  secp256k1_gej *psStack_770;
  secp256k1_gej *psStack_768;
  secp256k1_fe *psStack_758;
  secp256k1_gej sStack_750;
  secp256k1_gej sStack_6b8;
  secp256k1_ge sStack_620;
  secp256k1_gej *psStack_5b8;
  secp256k1_gej *psStack_5b0;
  secp256k1_gej *psStack_5a8;
  secp256k1_gej *psStack_5a0;
  secp256k1_gej *psStack_598;
  secp256k1_gej *psStack_590;
  undefined1 auStack_57c [92];
  secp256k1_gej *local_520;
  secp256k1_gej *local_518;
  secp256k1_gej *local_510;
  secp256k1_gej *local_508;
  secp256k1_gej *local_500;
  long local_4f8;
  long local_4f0;
  undefined1 local_4e8 [112];
  undefined1 local_478 [24];
  undefined1 local_460 [16];
  undefined8 local_450;
  secp256k1_scalar local_448 [132];
  secp256k1_gej local_238 [3];
  
  bVar32 = 0;
  local_478._0_8_ = 1;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_460 = (undefined1  [16])0x0;
  local_450._0_4_ = 1;
  local_450._4_4_ = 1;
  auStack_57c._76_8_ = 0x118e35;
  psVar13 = a;
  psVar18 = (secp256k1_gej *)na;
  local_508 = (secp256k1_gej *)ng;
  local_500 = r;
  secp256k1_fe_verify((secp256k1_fe *)local_478);
  if (num == 0) {
    local_520 = (secp256k1_gej *)0x0;
    psVar14 = (secp256k1_gej *)0x0;
  }
  else {
    psVar14 = (secp256k1_gej *)0x0;
    local_520 = (secp256k1_gej *)0x0;
    do {
      psVar30 = local_238;
      auStack_57c._76_8_ = 0x118e59;
      secp256k1_scalar_verify(na);
      if ((int)(((secp256k1_gej *)na)->x).n[0] != 0) {
        auStack_57c._76_8_ = 0x118e6c;
        secp256k1_gej_verify(a);
        iVar6 = (int)psVar13;
        if (a->infinity == 0) {
          auStack_57c._76_8_ = 0x118e8f;
          secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)local_4e8,na);
          lVar17 = (long)psVar14 * 0x410;
          auStack_57c._76_8_ = 0x118eaf;
          local_518 = psVar14;
          iVar6 = secp256k1_ecmult_wnaf
                            (state->ps[(long)psVar14].wnaf_na_1,(int)local_448,a_00,iVar6);
          psVar2 = state->ps;
          psVar29 = (secp256k1_gej *)psVar2[(long)psVar14].wnaf_na_lam;
          psVar2[(long)psVar14].bits_na_1 = iVar6;
          psVar19 = (secp256k1_gej *)local_4e8;
          auStack_57c._76_8_ = 0x118ece;
          uVar7 = secp256k1_ecmult_wnaf((int *)psVar29,(int)psVar19,a_01,(int)psVar2);
          psVar2 = state->ps;
          psVar2[(long)psVar14].bits_na_lam = uVar7;
          uVar9 = psVar2[(long)psVar14].bits_na_1;
          psVar13 = (secp256k1_gej *)(ulong)uVar9;
          if (0x81 < (int)uVar9) goto LAB_001194a6;
          if (0x81 < psVar2[(long)psVar14].bits_na_lam) goto LAB_001194ab;
          if ((int)uVar9 <= (int)local_520) {
            psVar13 = (secp256k1_gej *)((ulong)local_520 & 0xffffffff);
          }
          if ((int)psVar13 < (int)uVar7) {
            psVar13 = (secp256k1_gej *)(ulong)uVar7;
          }
          auStack_57c._76_8_ = 0x118f24;
          local_520 = psVar13;
          memcpy(psVar30,a,0x98);
          psVar14 = local_518;
          if (local_518 != (secp256k1_gej *)0x0) {
            auStack_57c._76_8_ = 0x118f44;
            secp256k1_gej_rescale(psVar30,(secp256k1_fe *)local_478);
          }
          psVar13 = local_238;
          auStack_57c._76_8_ = 0x118f70;
          secp256k1_ecmult_odd_multiples_table
                    ((int)psVar14 * 0x1a0 + (int)state->pre_a,
                     (secp256k1_ge *)(state->aux + (long)psVar14 * 4),(secp256k1_fe *)local_478,
                     &psVar13->x,psVar18);
          if (psVar14 != (secp256k1_gej *)0x0) {
            auStack_57c._76_8_ = 0x118f94;
            secp256k1_fe_mul(state->aux + (long)psVar14 * 4,state->aux + (long)psVar14 * 4,&a->z);
          }
          psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
        }
      }
      a = a + 1;
      na = (secp256k1_scalar *)((long)(((secp256k1_gej *)na)->x).n + 4);
      num = (size_t)&((secp256k1_gej *)(num + -0x98))->field_0x97;
    } while ((undefined1 *)num != (undefined1 *)0x0);
  }
  local_518 = psVar14;
  if (psVar14 != (secp256k1_gej *)0x0) {
    auStack_57c._76_8_ = 0x118fdb;
    secp256k1_ge_table_set_globalz((long)psVar14 * 4,state->pre_a,state->aux);
    lVar17 = 0;
    psVar18 = (secp256k1_gej *)0x0;
    psVar14 = (secp256k1_gej *)0x0;
    do {
      lVar20 = 0;
      local_510 = psVar18;
      do {
        auStack_57c._76_8_ = 0x119009;
        secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar20 + lVar17),
                         (secp256k1_fe *)((long)(state->pre_a->x).n + (long)(psVar18->x).n),
                         &secp256k1_const_beta);
        psVar18 = (secp256k1_gej *)((psVar18->z).n + 1);
        lVar20 = lVar20 + 0x30;
      } while (lVar20 != 0xc0);
      psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
      psVar18 = (secp256k1_gej *)(local_510[2].z.n + 2);
      lVar17 = lVar17 + 0xc0;
    } while (psVar14 != local_518);
  }
  psVar18 = local_508;
  if (local_508 == (secp256k1_gej *)0x0) {
    local_4f0 = 0;
    local_4f8 = 0;
    uVar9 = (uint)local_520;
  }
  else {
    auStack_57c._76_8_ = 0x119049;
    secp256k1_scalar_verify((secp256k1_scalar *)local_508);
    local_4e8._108_4_ = (undefined4)(psVar18->x).n[0];
    local_4e8._104_4_ = 0;
    auStack_57c._76_8_ = 0x11906e;
    secp256k1_scalar_verify((secp256k1_scalar *)(local_4e8 + 0x6c));
    auStack_57c._76_8_ = 0x119076;
    secp256k1_scalar_verify((secp256k1_scalar *)(local_4e8 + 0x68));
    auStack_57c._76_8_ = 0x119086;
    uVar7 = secp256k1_ecmult_wnaf((int *)local_238,(int)(local_4e8 + 0x6c),a_02,(int)psVar13);
    auStack_57c._76_8_ = 0x119098;
    uVar8 = secp256k1_ecmult_wnaf((int *)local_448,(int)(local_4e8 + 0x68),a_03,(int)psVar13);
    uVar9 = (uint)local_520;
    if ((int)(uint)local_520 < (int)uVar7) {
      uVar9 = uVar7;
    }
    if ((int)uVar9 < (int)uVar8) {
      uVar9 = uVar8;
    }
    local_4f8 = (long)(int)uVar8;
    local_4f0 = (long)(int)uVar7;
  }
  psVar29 = local_500;
  auStack_57c._76_8_ = 0x1190dc;
  secp256k1_gej_set_infinity(local_500);
  if (0 < (int)uVar9) {
    psVar18 = (secp256k1_gej *)(ulong)uVar9;
    local_508 = (secp256k1_gej *)((long)psVar18 * 4 + -4);
    local_520 = (secp256k1_gej *)state;
    do {
      auStack_57c._76_8_ = 0x119105;
      secp256k1_gej_double_var(psVar29,psVar29,(secp256k1_fe *)0x0);
      local_510 = psVar18;
      psVar19 = psVar18;
      if (local_518 != (secp256k1_gej *)0x0) {
        psVar30 = (secp256k1_gej *)0x40c;
        a = (secp256k1_gej *)0x30;
        lVar17 = 0;
        num = (size_t)local_508;
        na = (secp256k1_scalar *)local_518;
        do {
          uVar22 = (((secp256k1_gej *)state)->x).n[2];
          psVar13 = (secp256k1_gej *)(long)*(int *)((long)(psVar30->x).n + (uVar22 - 4));
          if (((long)psVar19 <= (long)psVar13) &&
             (uVar9 = *(uint *)((long)(((secp256k1_gej *)num)->x).n + uVar22), uVar9 != 0)) {
            if ((uVar9 & 1) == 0) {
              auStack_57c._76_8_ = 0x11948d;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0011948d:
              auStack_57c._76_8_ = 0x119492;
              secp256k1_ecmult_strauss_wnaf_cold_8();
LAB_00119492:
              auStack_57c._76_8_ = 0x119497;
              secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_00119497:
              auStack_57c._76_8_ = 0x11949c;
              secp256k1_ecmult_strauss_wnaf_cold_7();
            }
            else {
              if ((int)uVar9 < -7) goto LAB_00119492;
              if ((int)uVar9 < 8) {
                uVar22 = (((secp256k1_gej *)state)->x).n[1];
                if ((int)uVar9 < 1) {
                  puVar23 = (undefined8 *)
                            ((long)&a->x + uVar22 + (ulong)(~uVar9 >> 1) * 0x68 + -0x30);
                  puVar25 = (undefined8 *)local_4e8;
                  for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
                    *puVar25 = *puVar23;
                    puVar23 = puVar23 + (ulong)bVar32 * -2 + 1;
                    puVar25 = puVar25 + (ulong)bVar32 * -2 + 1;
                  }
                  psVar28 = (secp256k1_fe *)(local_4e8 + 0x30);
                  auStack_57c._76_8_ = 0x1191c5;
                  secp256k1_fe_verify(psVar28);
                  auStack_57c._76_8_ = 0x1191d2;
                  secp256k1_fe_verify_magnitude(psVar28,1);
                  local_4e8._48_8_ = 0x3ffffbfffff0bc - local_4e8._48_8_;
                  local_4e8._56_8_ = 0x3ffffffffffffc - local_4e8._56_8_;
                  local_4e8._64_8_ = 0x3ffffffffffffc - local_4e8._64_8_;
                  local_4e8._72_8_ = 0x3ffffffffffffc - local_4e8._72_8_;
                  local_4e8._80_8_ = 0x3fffffffffffc - local_4e8._80_8_;
                  local_4e8._88_4_ = 2;
                  local_4e8._92_4_ = 0;
                  auStack_57c._76_8_ = 0x119236;
                  secp256k1_fe_verify(psVar28);
                  state = (secp256k1_strauss_state *)local_520;
                }
                else {
                  puVar23 = (undefined8 *)
                            ((long)&a->x + uVar22 + (ulong)(uVar9 - 1 >> 1) * 0x68 + -0x30);
                  puVar25 = (undefined8 *)local_4e8;
                  for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
                    *puVar25 = *puVar23;
                    puVar23 = puVar23 + (ulong)bVar32 * -2 + 1;
                    puVar25 = puVar25 + (ulong)bVar32 * -2 + 1;
                  }
                }
                auStack_57c._76_8_ = 0x119252;
                psVar29 = local_500;
                secp256k1_gej_add_ge_var
                          (local_500,local_500,(secp256k1_ge *)local_4e8,(secp256k1_fe *)0x0);
                psVar19 = local_510;
                goto LAB_00119257;
              }
            }
            auStack_57c._76_8_ = 0x1194a1;
            secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_001194a1:
            auStack_57c._76_8_ = 0x1194a6;
            secp256k1_ecmult_strauss_wnaf_cold_6();
            goto LAB_001194a6;
          }
LAB_00119257:
          uVar22 = (((secp256k1_gej *)state)->x).n[2];
          psVar13 = (secp256k1_gej *)(long)*(int *)((long)(psVar30->x).n + uVar22);
          if (((long)psVar19 <= (long)psVar13) &&
             (uVar9 = *(uint *)((long)(((secp256k1_gej *)(num + 0x1c8))->y).n + uVar22 + 0xc),
             uVar9 != 0)) {
            if ((uVar9 & 1) == 0) goto LAB_0011948d;
            if ((int)uVar9 < -7) goto LAB_00119497;
            if ((int)uVar9 < 8) {
              uVar22 = (((secp256k1_gej *)state)->x).n[0];
              uVar3 = (((secp256k1_gej *)state)->x).n[1];
              if ((int)uVar9 < 1) {
                auStack_57c._76_8_ = 0x1192f3;
                secp256k1_ge_set_xy((secp256k1_ge *)local_4e8,
                                    (secp256k1_fe *)(uVar22 + lVar17 + (ulong)(~uVar9 >> 1) * 0x30),
                                    (secp256k1_fe *)
                                    ((long)&a->x + (ulong)(~uVar9 >> 1) * 0x68 + uVar3));
                auStack_57c._76_8_ = 0x1192fd;
                secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
                auStack_57c._76_8_ = 0x11930c;
                secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_4e8 + 0x30),1);
                local_4e8._48_8_ = 0x3ffffbfffff0bc - local_4e8._48_8_;
                local_4e8._56_8_ = 0x3ffffffffffffc - local_4e8._56_8_;
                local_4e8._64_8_ = 0x3ffffffffffffc - local_4e8._64_8_;
                local_4e8._72_8_ = 0x3ffffffffffffc - local_4e8._72_8_;
                local_4e8._80_8_ = 0x3fffffffffffc - local_4e8._80_8_;
                local_4e8._88_4_ = 2;
                local_4e8._92_4_ = 0;
                auStack_57c._76_8_ = 0x119372;
                secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
              }
              else {
                uVar12 = (ulong)(uVar9 - 1 >> 1);
                auStack_57c._76_8_ = 0x1192c5;
                secp256k1_ge_set_xy((secp256k1_ge *)local_4e8,
                                    (secp256k1_fe *)(uVar22 + lVar17 + uVar12 * 0x30),
                                    (secp256k1_fe *)((long)&a->x + uVar12 * 0x68 + uVar3));
              }
              psVar13 = (secp256k1_gej *)0x0;
              auStack_57c._76_8_ = 0x119384;
              psVar29 = local_500;
              secp256k1_gej_add_ge_var
                        (local_500,local_500,(secp256k1_ge *)local_4e8,(secp256k1_fe *)0x0);
              psVar19 = local_510;
              state = (secp256k1_strauss_state *)local_520;
              goto LAB_0011938e;
            }
            goto LAB_001194a1;
          }
LAB_0011938e:
          num = (size_t)((((secp256k1_gej *)(num + 0x390))->z).n + 4);
          psVar30 = (secp256k1_gej *)(psVar30[6].z.n + 4);
          a = (secp256k1_gej *)(a[2].z.n + 2);
          lVar17 = lVar17 + 0xc0;
          na = (secp256k1_scalar *)&((secp256k1_gej *)((long)na + -0x98))->field_0x97;
        } while (na != (secp256k1_scalar *)0x0);
      }
      psVar29 = local_500;
      psVar18 = (secp256k1_gej *)&psVar19[-1].field_0x97;
      if (((long)psVar19 <= local_4f0) &&
         (iVar6 = *(int *)((long)local_238[0].x.n + (long)psVar18 * 4), iVar6 != 0)) {
        auStack_57c._76_8_ = 0x1193df;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)local_4e8,secp256k1_pre_g,iVar6,(int)psVar13);
        state = (secp256k1_strauss_state *)local_520;
        psVar13 = (secp256k1_gej *)local_478;
        auStack_57c._76_8_ = 0x1193fa;
        secp256k1_gej_add_zinv_var
                  (psVar29,psVar29,(secp256k1_ge *)local_4e8,(secp256k1_fe *)psVar13);
        psVar19 = local_510;
      }
      if (((long)psVar19 <= local_4f8) && (local_448[(long)psVar18] != 0)) {
        auStack_57c._76_8_ = 0x119425;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)local_4e8,secp256k1_pre_g_128,local_448[(long)psVar18],
                   (int)psVar13);
        state = (secp256k1_strauss_state *)local_520;
        psVar13 = (secp256k1_gej *)local_478;
        auStack_57c._76_8_ = 0x119440;
        secp256k1_gej_add_zinv_var
                  (psVar29,psVar29,(secp256k1_ge *)local_4e8,(secp256k1_fe *)psVar13);
        psVar19 = local_510;
      }
      local_508 = (secp256k1_gej *)&local_508[-1].field_0x94;
    } while (1 < (long)psVar19);
  }
  if (psVar29->infinity == 0) {
    auStack_57c._76_8_ = 0x119476;
    secp256k1_fe_mul(&psVar29->z,&psVar29->z,(secp256k1_fe *)local_478);
  }
  return;
LAB_00119691:
  psStack_590 = (secp256k1_gej *)0x119696;
  secp256k1_ecmult_wnaf_cold_3();
LAB_00119696:
  psStack_590 = (secp256k1_gej *)0x11969b;
  secp256k1_ecmult_wnaf_cold_5();
  psVar21 = (secp256k1_gej *)num;
  psVar14 = psVar29;
  goto LAB_0011969b;
LAB_001194a6:
  auStack_57c._76_8_ = 0x1194ab;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_001194ab:
  auStack_57c._76_8_ = secp256k1_scalar_split_lambda;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  auStack_57c._52_8_ = 0x1194c6;
  psVar14 = psVar19;
  psVar18 = r_00;
  auStack_57c._60_8_ = lVar17;
  auStack_57c._68_8_ = state;
  auStack_57c._76_8_ = psVar30;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if (psVar29 == r_00) {
    auStack_57c._52_8_ = 0x119532;
    secp256k1_scalar_split_lambda_cold_3();
LAB_00119532:
    auStack_57c._52_8_ = 0x119537;
    secp256k1_scalar_split_lambda_cold_2();
  }
  else {
    if (psVar19 == r_00) goto LAB_00119532;
    if (psVar29 != psVar19) {
      iVar6 = (int)(r_00->x).n[0];
      uVar9 = iVar6 + 5;
      iVar6 = (iVar6 - (uVar9 / 0xd + (uVar9 / 0xd) * 0xc)) + 5;
      *(int *)(psVar19->x).n = iVar6;
      uVar9 = (0xd - iVar6) * 9 + (int)(r_00->x).n[0];
      *(uint *)(psVar29->x).n = uVar9 - (uVar9 / 0xd + (uVar9 / 0xd) * 0xc);
      auStack_57c._52_8_ = 0x119520;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar29);
      secp256k1_scalar_verify((secp256k1_scalar *)psVar19);
      return;
    }
  }
  auStack_57c._52_8_ = secp256k1_ecmult_wnaf;
  secp256k1_scalar_split_lambda_cold_1();
  a_06 = psVar14;
  psVar30 = r_00;
  auStack_57c._12_8_ = psVar19;
  auStack_57c._20_8_ = na;
  auStack_57c._28_8_ = a;
  auStack_57c._36_8_ = psVar29;
  auStack_57c._52_8_ = num;
  if (psVar18 == (secp256k1_gej *)0x0) goto LAB_00119696;
  psVar21 = (secp256k1_gej *)num;
  if (psVar14 != (secp256k1_gej *)0x0) {
    a_06 = (secp256k1_gej *)0x0;
    psStack_590 = (secp256k1_gej *)0x119575;
    auStack_57c._4_8_ = psVar18;
    memset(psVar18,0,0x204);
    uVar9 = (uint)(psVar14->x).n[0];
    a = (secp256k1_gej *)(ulong)uVar9;
    psVar30 = (secp256k1_gej *)auStack_57c;
    psStack_590 = (secp256k1_gej *)0x119588;
    auStack_57c._0_4_ = uVar9;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar30);
    psVar19 = (secp256k1_gej *)0x0;
    num = (size_t)(secp256k1_gej *)0xffffffff;
    na = (secp256k1_scalar *)(secp256k1_gej *)0x0;
    do {
      psVar21 = (secp256k1_gej *)na;
      psStack_590 = (secp256k1_gej *)0x11959a;
      psVar18 = psVar30;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar30);
      uVar7 = (uint)psVar21;
      psVar13 = psVar21;
      if (((uint)(uVar7 < 0x20) & uVar9 >> ((byte)psVar21 & 0x1f)) == (uint)psVar19) {
        uVar7 = uVar7 + 1;
        psVar21 = (secp256k1_gej *)num;
      }
      else {
        uVar8 = 0x81 - uVar7;
        if ((int)uVar7 < 0x7e) {
          uVar8 = 4;
        }
        psVar29 = (secp256k1_gej *)(ulong)uVar8;
        psStack_590 = (secp256k1_gej *)0x1195d7;
        secp256k1_scalar_verify((secp256k1_scalar *)psVar30);
        psStack_590 = (secp256k1_gej *)0x1195df;
        psVar18 = psVar30;
        secp256k1_scalar_verify((secp256k1_scalar *)psVar30);
        if (uVar8 - 0x21 < 0xffffffe0) {
          psStack_590 = (secp256k1_gej *)0x119691;
          secp256k1_ecmult_wnaf_cold_1();
          na = (secp256k1_scalar *)psVar21;
          goto LAB_00119691;
        }
        uVar10 = ((uVar9 >> ((byte)psVar21 & 0x1f)) << (-(char)uVar8 & 0x1fU)) >>
                 (-(char)uVar8 & 0x1fU);
        if (0x1f < uVar7) {
          uVar10 = 0;
        }
        uVar10 = uVar10 + (uint)psVar19;
        uVar16 = uVar10 >> 3 & 1;
        psVar19 = (secp256k1_gej *)(ulong)uVar16;
        psVar13 = (secp256k1_gej *)(long)(int)uVar7;
        *(uint *)((long)((secp256k1_fe *)auStack_57c._4_8_)->n + (long)psVar13 * 4) =
             uVar10 + uVar16 * -0x10;
        uVar7 = uVar8 + uVar7;
      }
      uVar5 = auStack_57c._0_4_;
      na = (secp256k1_scalar *)(ulong)uVar7;
      num = (size_t)psVar21;
    } while ((int)uVar7 < 0x81);
    psVar14 = (secp256k1_gej *)na;
    if ((int)psVar19 == 0) {
      if ((int)uVar7 < 0x100) {
        psVar19 = (secp256k1_gej *)auStack_57c;
        psVar30 = (secp256k1_gej *)(ulong)(uint)auStack_57c._0_4_;
        psVar13 = (secp256k1_gej *)na;
        do {
          psStack_590 = (secp256k1_gej *)0x119658;
          psVar18 = psVar19;
          secp256k1_scalar_verify((secp256k1_scalar *)psVar19);
          if (((uint)psVar13 < 0x20) &&
             (psVar29 = psVar13, (1 << ((byte)psVar13 & 0x1f) & uVar5) != 0)) goto LAB_00119691;
          uVar9 = (uint)psVar13 + 1;
          psVar13 = (secp256k1_gej *)(ulong)uVar9;
        } while (uVar9 != 0x100);
      }
      return;
    }
    goto LAB_001196a0;
  }
LAB_0011969b:
  psStack_590 = (secp256k1_gej *)0x1196a0;
  secp256k1_ecmult_wnaf_cold_4();
LAB_001196a0:
  psStack_590 = (secp256k1_gej *)secp256k1_ecmult_odd_multiples_table;
  secp256k1_ecmult_wnaf_cold_2();
  psStack_5b8 = psVar19;
  psStack_5b0 = (secp256k1_gej *)na;
  psStack_5a8 = a;
  psStack_5a0 = psVar14;
  psStack_598 = psVar30;
  psStack_590 = psVar21;
  if (psVar13->infinity == 0) {
    psStack_768 = (secp256k1_gej *)0x1196e6;
    psStack_758 = extraout_RDX;
    secp256k1_gej_double_var(&sStack_6b8,psVar13,(secp256k1_fe *)0x0);
    psStack_768 = (secp256k1_gej *)0x119701;
    secp256k1_ge_set_xy(&sStack_620,&sStack_6b8.x,&sStack_6b8.y);
    psStack_768 = (secp256k1_gej *)0x119717;
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar18,psVar13,&sStack_6b8.z);
    psStack_768 = (secp256k1_gej *)0x119727;
    secp256k1_gej_set_ge(&sStack_750,(secp256k1_ge *)psVar18);
    sStack_750.z.n[0] = (psVar13->z).n[0];
    sStack_750.z.n[1] = (psVar13->z).n[1];
    sStack_750.z.n[2] = (psVar13->z).n[2];
    sStack_750.z.n[3] = (psVar13->z).n[3];
    sStack_750.z.n[4] = (psVar13->z).n[4];
    sStack_750.z.magnitude = (psVar13->z).magnitude;
    sStack_750.z.normalized = (psVar13->z).normalized;
    (a_06->x).n[4] = sStack_6b8.z.n[4];
    (a_06->x).magnitude = sStack_6b8.z.magnitude;
    (a_06->x).normalized = sStack_6b8.z.normalized;
    (a_06->x).n[2] = sStack_6b8.z.n[2];
    (a_06->x).n[3] = sStack_6b8.z.n[3];
    (a_06->x).n[0] = sStack_6b8.z.n[0];
    (a_06->x).n[1] = sStack_6b8.z.n[1];
    lVar17 = 0x30;
    do {
      psVar18 = (secp256k1_gej *)((psVar18->z).n + 1);
      psStack_768 = (secp256k1_gej *)0x119784;
      secp256k1_gej_add_ge_var
                (&sStack_750,&sStack_750,&sStack_620,(secp256k1_fe *)((long)(a_06->x).n + lVar17));
      psStack_768 = (secp256k1_gej *)0x119792;
      secp256k1_ge_set_xy((secp256k1_ge *)psVar18,&sStack_750.x,&sStack_750.y);
      lVar17 = lVar17 + 0x30;
    } while (lVar17 != 0xc0);
    psStack_768 = (secp256k1_gej *)0x1197ba;
    secp256k1_fe_mul(psStack_758,&sStack_750.z,&sStack_6b8.z);
    return;
  }
  psStack_768 = (secp256k1_gej *)secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar13 = a_06;
  psVar28 = extraout_RDX_00;
  psStack_838 = psVar18;
  psStack_790 = psVar19;
  psStack_788 = (secp256k1_gej *)na;
  psStack_780 = a;
  psStack_778 = psVar14;
  psStack_770 = psVar30;
  psStack_768 = psVar21;
  if (psVar18 != (secp256k1_gej *)0x0) {
    do {
      psStack_840 = (secp256k1_gej *)0x119806;
      secp256k1_ge_verify((secp256k1_ge *)psVar13);
      psStack_840 = (secp256k1_gej *)0x11980e;
      secp256k1_fe_verify(psVar28);
      psVar28 = psVar28 + 1;
      psVar18 = (secp256k1_gej *)&psVar18[-1].field_0x97;
      psVar13 = (secp256k1_gej *)((psVar13->z).n + 1);
    } while (psVar18 != (secp256k1_gej *)0x0);
    psVar28 = (secp256k1_fe *)&psStack_838[-1].field_0x97;
    psVar31 = (secp256k1_fe *)((long)&a_06->y + (long)psVar28 * 0x68);
    psStack_840 = (secp256k1_gej *)0x119837;
    secp256k1_fe_verify(psVar31);
    uVar12 = *(ulong *)((long)&a_06->z + (long)psVar28 * 0x68 + -0x10);
    uVar15 = (uVar12 >> 0x30) * 0x1000003d1 + psVar31->n[0];
    uVar11 = (uVar15 >> 0x34) + *(long *)((long)&a_06->y + (long)psVar28 * 0x68 + 8);
    uVar24 = (uVar11 >> 0x34) + *(long *)((long)&a_06->y + (long)psVar28 * 0x68 + 0x10);
    uVar26 = (uVar24 >> 0x34) + *(long *)((long)&a_06->y + (long)psVar28 * 0x68 + 0x18);
    psVar13 = (secp256k1_gej *)(uVar24 & 0xfffffffffffff);
    psVar31->n[0] = uVar15 & 0xfffffffffffff;
    *(ulong *)((long)&a_06->y + (long)psVar28 * 0x68 + 8) = uVar11 & 0xfffffffffffff;
    *(secp256k1_gej **)((long)&a_06->y + (long)psVar28 * 0x68 + 0x10) = psVar13;
    *(ulong *)((long)&a_06->y + (long)psVar28 * 0x68 + 0x18) = uVar26 & 0xfffffffffffff;
    *(ulong *)((long)&a_06->z + (long)psVar28 * 0x68 + -0x10) =
         (uVar26 >> 0x34) + (uVar12 & 0xffffffffffff);
    *(undefined4 *)((long)&a_06->z + (long)psVar28 * 0x68 + -8) = 1;
    psStack_840 = (secp256k1_gej *)0x1198cc;
    secp256k1_fe_verify(psVar31);
    sStack_828.x.n[0] = extraout_RDX_00[(long)psVar28].n[0];
    sStack_828.x.n[1] = extraout_RDX_00[(long)psVar28].n[1];
    sStack_828.x.n[2] = extraout_RDX_00[(long)psVar28].n[2];
    sStack_828.x.n[3] = (extraout_RDX_00[(long)psVar28].n + 2)[1];
    sStack_828.x.n[4] = extraout_RDX_00[(long)psVar28].n[4];
    sStack_828.x._40_8_ = (extraout_RDX_00[(long)psVar28].n + 4)[1];
    psVar18 = psStack_838;
    puStack_830 = (undefined1 *)psVar28;
    if (psVar28 != (secp256k1_fe *)0x0) {
      psVar27 = (secp256k1_ge *)((long)a_06 + (long)psStack_838 * 0x68 + -0xd0);
      psVar31 = extraout_RDX_00 + (long)psStack_838;
      uVar22 = 0;
      psVar14 = psStack_838;
      do {
        psVar31 = psVar31 + -1;
        if (uVar22 != 0) {
          psStack_840 = (secp256k1_gej *)0x119945;
          psVar13 = &sStack_828;
          secp256k1_fe_mul(&sStack_828.x,&sStack_828.x,psVar31);
        }
        psStack_840 = (secp256k1_gej *)0x11994d;
        secp256k1_ge_verify(psVar27);
        psStack_840 = (secp256k1_gej *)0x119955;
        psVar18 = &sStack_828;
        secp256k1_fe_verify(&sStack_828.x);
        if (psVar27->infinity != 0) {
          psStack_840 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
          secp256k1_ge_table_set_globalz_cold_1();
          psStack_848 = a_06;
          psStack_840 = &sStack_828;
          if ((extraout_RDX_01 & 1) == 0) {
            pcStack_858 = (code *)0x119ab1;
            secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00119ab1:
            pcStack_858 = (code *)0x119ab6;
            secp256k1_ecmult_table_get_ge_storage_cold_2();
          }
          else {
            uVar9 = (uint)extraout_RDX_01;
            if ((int)uVar9 < -7) goto LAB_00119ab1;
            if ((int)uVar9 < 8) {
              if (0 < (int)uVar9) {
                secp256k1_ge_from_storage
                          ((secp256k1_ge *)psVar18,
                           (secp256k1_ge_storage *)
                           ((long)&psVar13->x + (ulong)(uVar9 - 1 >> 1) * 0x40));
                return;
              }
              pcStack_858 = (code *)0x119a3e;
              secp256k1_ge_from_storage
                        ((secp256k1_ge *)psVar18,
                         (secp256k1_ge_storage *)((long)&psVar13->x + (ulong)(~uVar9 >> 1) * 0x40));
              psVar28 = &psVar18->y;
              pcStack_858 = (code *)0x119a4a;
              secp256k1_fe_verify(psVar28);
              pcStack_858 = (code *)0x119a57;
              secp256k1_fe_verify_magnitude(psVar28,1);
              uVar22 = (psVar18->y).n[1];
              uVar3 = (psVar18->y).n[2];
              uVar4 = (psVar18->y).n[3];
              (psVar18->y).n[0] = 0x3ffffbfffff0bc - (psVar18->y).n[0];
              (psVar18->y).n[1] = 0x3ffffffffffffc - uVar22;
              (psVar18->y).n[2] = 0x3ffffffffffffc - uVar3;
              (psVar18->y).n[3] = 0x3ffffffffffffc - uVar4;
              (psVar18->y).n[4] = 0x3fffffffffffc - (psVar18->y).n[4];
              (psVar18->y).magnitude = 2;
              (psVar18->y).normalized = 0;
              secp256k1_fe_verify(psVar28);
              return;
            }
          }
          pcStack_858 = secp256k1_gej_add_zinv_var;
          secp256k1_ecmult_table_get_ge_storage_cold_1();
          psStack_ab0 = (secp256k1_gej *)0x119ae0;
          auStack_8b8._56_8_ = a_06;
          auStack_8b8._64_8_ = psVar27;
          auStack_8b8._72_8_ = psVar28;
          auStack_8b8._80_8_ = &sStack_828;
          auStack_8b8._88_8_ = psVar31;
          pcStack_858 = (code *)uVar22;
          secp256k1_gej_verify(psVar13);
          psStack_ab0 = (secp256k1_gej *)0x119ae8;
          secp256k1_ge_verify(a_04);
          psStack_ab0 = (secp256k1_gej *)0x119af0;
          secp256k1_fe_verify(&psVar14->x);
          if (psVar13->infinity != 0) {
            psVar18->infinity = a_04->infinity;
            psStack_ab0 = (secp256k1_gej *)0x119b1c;
            secp256k1_fe_sqr(&sStack_978,&psVar14->x);
            psStack_ab0 = (secp256k1_gej *)0x119b32;
            secp256k1_fe_mul(&sStack_8e8,&sStack_978,&psVar14->x);
            psStack_ab0 = (secp256k1_gej *)0x119b40;
            secp256k1_fe_mul(&psVar18->x,&a_04->x,&sStack_978);
            psStack_ab0 = (secp256k1_gej *)0x119b53;
            secp256k1_fe_mul(&psVar18->y,&a_04->y,&sStack_8e8);
            psVar13 = (secp256k1_gej *)&psVar18->z;
            (psVar18->z).n[0] = 1;
            (psVar18->z).n[1] = 0;
            (psVar18->z).n[2] = 0;
            (psVar18->z).n[3] = 0;
            (psVar18->z).n[4] = 0;
            (psVar18->z).magnitude = 1;
            (psVar18->z).normalized = 1;
LAB_00119b7e:
            psStack_ab0 = (secp256k1_gej *)0x119b83;
            secp256k1_fe_verify(&psVar13->x);
            psStack_ab0 = (secp256k1_gej *)0x119b8b;
            secp256k1_gej_verify(psVar18);
            return;
          }
          if (a_04->infinity != 0) {
            memcpy(psVar18,psVar13,0x98);
            return;
          }
          psStack_aa0 = &psVar13->z;
          psStack_ab0 = (secp256k1_gej *)0x119be2;
          secp256k1_fe_mul(&sStack_978,psStack_aa0,&psVar14->x);
          psVar28 = &sStack_8e8;
          psStack_ab0 = (secp256k1_gej *)0x119bf5;
          secp256k1_fe_sqr(psVar28,&sStack_978);
          sStack_918.n[0] = (psVar13->x).n[0];
          sStack_918.n[1] = (psVar13->x).n[1];
          sStack_918.n[2] = (psVar13->x).n[2];
          sStack_918.n[3] = (psVar13->x).n[3];
          sStack_918.n[4] = (psVar13->x).n[4];
          sStack_918.magnitude = (psVar13->x).magnitude;
          sStack_918.normalized = (psVar13->x).normalized;
          psStack_ab0 = (secp256k1_gej *)0x119c2a;
          secp256k1_fe_mul((secp256k1_fe *)(auStack_9d8 + 0x30),&a_04->x,psVar28);
          auStack_a38._0_8_ = (psVar13->y).n[0];
          auStack_a38._8_8_ = (psVar13->y).n[1];
          auStack_a38._16_8_ = (psVar13->y).n[2];
          auStack_a38._24_8_ = (psVar13->y).n[3];
          auStack_a38._32_8_ = (psVar13->y).n[4];
          auStack_a38._40_4_ = (psVar13->y).magnitude;
          auStack_a38._44_4_ = (psVar13->y).normalized;
          psStack_ab0 = (secp256k1_gej *)0x119c68;
          secp256k1_fe_mul(&sStack_948,&a_04->y,psVar28);
          psStack_ab0 = (secp256k1_gej *)0x119c7b;
          secp256k1_fe_mul(&sStack_948,&sStack_948,&sStack_978);
          psStack_ab0 = (secp256k1_gej *)0x119c83;
          secp256k1_fe_verify(&sStack_918);
          psVar30 = (secp256k1_gej *)0x4;
          psStack_ab0 = (secp256k1_gej *)0x119c90;
          secp256k1_fe_verify_magnitude(&sStack_918,4);
          auStack_a38._48_8_ = 0x9ffff5ffffd9d6 - sStack_918.n[0];
          uStack_a00 = 0x9ffffffffffff6 - sStack_918.n[1];
          psVar19 = (secp256k1_gej *)(auStack_a38 + 0x30);
          uStack_9f8 = 0x9ffffffffffff6 - sStack_918.n[2];
          uStack_9f0 = 0x9ffffffffffff6 - sStack_918.n[3];
          uStack_9e8 = 0x9fffffffffff6 - sStack_918.n[4];
          uStack_9e0 = 5;
          psStack_ab0 = (secp256k1_gej *)0x119cdf;
          secp256k1_fe_verify((secp256k1_fe *)psVar19);
          psStack_ab0 = (secp256k1_gej *)0x119ce7;
          secp256k1_fe_verify((secp256k1_fe *)psVar19);
          psVar14 = (secp256k1_gej *)(auStack_9d8 + 0x30);
          psStack_ab0 = (secp256k1_gej *)0x119cf7;
          psVar29 = psVar14;
          secp256k1_fe_verify((secp256k1_fe *)psVar14);
          if (iStack_980 + (int)uStack_9e0 < 0x21) {
            auStack_a38._48_8_ = auStack_a38._48_8_ + auStack_9d8._48_8_;
            uStack_a00 = uStack_a00 + uStack_9a0;
            uStack_9f8 = uStack_9f8 + uStack_998;
            uStack_9f0 = uStack_9f0 + uStack_990;
            uStack_9e8 = uStack_9e8 + uStack_988;
            psVar28 = (secp256k1_fe *)0x3fffffffffffc;
            uStack_9e0 = (ulong)(uint)(iStack_980 + (int)uStack_9e0);
            psStack_ab0 = (secp256k1_gej *)0x119d5a;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_a38 + 0x30));
            psStack_ab0 = (secp256k1_gej *)0x119d6a;
            secp256k1_fe_verify(&sStack_948);
            psVar30 = (secp256k1_gej *)0x1;
            psStack_ab0 = (secp256k1_gej *)0x119d77;
            secp256k1_fe_verify_magnitude(&sStack_948,1);
            auStack_a98._48_8_ = 0x3ffffbfffff0bc - sStack_948.n[0];
            uStack_a60 = 0x3ffffffffffffc - sStack_948.n[1];
            psVar14 = (secp256k1_gej *)(auStack_a98 + 0x30);
            uStack_a58 = 0x3ffffffffffffc - sStack_948.n[2];
            uStack_a50 = 0x3ffffffffffffc - sStack_948.n[3];
            uStack_a48 = 0x3fffffffffffc - sStack_948.n[4];
            uStack_a40 = 2;
            psStack_ab0 = (secp256k1_gej *)0x119dc1;
            secp256k1_fe_verify((secp256k1_fe *)psVar14);
            psStack_ab0 = (secp256k1_gej *)0x119dc9;
            secp256k1_fe_verify((secp256k1_fe *)psVar14);
            psVar19 = (secp256k1_gej *)auStack_a38;
            psStack_ab0 = (secp256k1_gej *)0x119dd6;
            psVar29 = psVar19;
            secp256k1_fe_verify((secp256k1_fe *)psVar19);
            if (0x20 < auStack_a38._40_4_ + (int)uStack_a40) goto LAB_0011a2a2;
            auStack_a98._48_8_ = auStack_a98._48_8_ + auStack_a38._0_8_;
            uStack_a60 = uStack_a60 + auStack_a38._8_8_;
            uStack_a58 = uStack_a58 + auStack_a38._16_8_;
            uStack_a50 = uStack_a50 + auStack_a38._24_8_;
            uStack_a48 = uStack_a48 + auStack_a38._32_8_;
            uStack_a40 = (ulong)(uint)(auStack_a38._40_4_ + (int)uStack_a40);
            psStack_ab0 = (secp256k1_gej *)0x119e3d;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_a98 + 0x30));
            psStack_ab0 = (secp256k1_gej *)0x119e4d;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_a38 + 0x30));
            uVar12 = (uStack_9e8 >> 0x30) * 0x1000003d1 + auStack_a38._48_8_;
            if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)
               ) {
              uVar11 = (uVar12 >> 0x34) + uStack_a00;
              uVar15 = (uVar11 >> 0x34) + uStack_9f8;
              uVar24 = (uVar15 >> 0x34) + uStack_9f0;
              uVar26 = (uVar24 >> 0x34) + (uStack_9e8 & 0xffffffffffff);
              if ((((uVar11 | uVar12 | uVar15 | uVar24) & 0xfffffffffffff) == 0 && uVar26 == 0) ||
                 (((uVar12 | 0x1000003d0) & uVar11 & uVar15 & uVar24 & (uVar26 ^ 0xf000000000000))
                  == 0xfffffffffffff)) {
                psStack_ab0 = (secp256k1_gej *)0x11a1df;
                secp256k1_fe_verify((secp256k1_fe *)(auStack_a98 + 0x30));
                uVar12 = (uStack_a48 >> 0x30) * 0x1000003d1 + auStack_a98._48_8_;
                if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
                   ((uVar12 & 0xfffffffffffff) == 0)) {
                  uVar11 = (uVar12 >> 0x34) + uStack_a60;
                  uVar15 = (uVar11 >> 0x34) + uStack_a58;
                  uVar24 = (uVar15 >> 0x34) + uStack_a50;
                  uVar26 = (uVar24 >> 0x34) + (uStack_a48 & 0xffffffffffff);
                  if ((((uVar11 | uVar12 | uVar15 | uVar24) & 0xfffffffffffff) == 0 && uVar26 == 0)
                     || (((uVar12 | 0x1000003d0) & uVar11 & uVar15 & uVar24 &
                         (uVar26 ^ 0xf000000000000)) == 0xfffffffffffff)) {
                    psStack_ab0 = (secp256k1_gej *)0x11a298;
                    secp256k1_gej_double_var(psVar18,psVar13,(secp256k1_fe *)0x0);
                    return;
                  }
                }
                psStack_ab0 = (secp256k1_gej *)0x11a286;
                secp256k1_gej_set_infinity(psVar18);
                return;
              }
            }
            psVar18->infinity = 0;
            psVar19 = (secp256k1_gej *)(auStack_a38 + 0x30);
            psStack_ab0 = (secp256k1_gej *)0x119f2a;
            secp256k1_fe_mul(&psVar18->z,psStack_aa0,(secp256k1_fe *)psVar19);
            psVar13 = (secp256k1_gej *)auStack_8b8;
            psStack_ab0 = (secp256k1_gej *)0x119f3d;
            secp256k1_fe_sqr((secp256k1_fe *)psVar13,(secp256k1_fe *)psVar19);
            psStack_ab0 = (secp256k1_gej *)0x119f45;
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            psStack_ab0 = (secp256k1_gej *)0x119f52;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar13,1);
            auStack_8b8._0_8_ = 0x3ffffbfffff0bc - auStack_8b8._0_8_;
            auStack_8b8._8_8_ = 0x3ffffffffffffc - auStack_8b8._8_8_;
            auStack_8b8._16_8_ = 0x3ffffffffffffc - auStack_8b8._16_8_;
            auStack_8b8._24_8_ = 0x3ffffffffffffc - auStack_8b8._24_8_;
            psVar28 = (secp256k1_fe *)(0x3fffffffffffc - auStack_8b8._32_8_);
            auStack_8b8._40_4_ = 2;
            auStack_8b8._44_4_ = 0;
            psStack_ab0 = (secp256k1_gej *)0x119f90;
            auStack_8b8._32_8_ = psVar28;
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            psVar14 = (secp256k1_gej *)auStack_a98;
            psStack_ab0 = (secp256k1_gej *)0x119fa3;
            secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar13,(secp256k1_fe *)psVar19
                            );
            psStack_ab0 = (secp256k1_gej *)0x119fbb;
            secp256k1_fe_mul((secp256k1_fe *)auStack_9d8,&sStack_918,(secp256k1_fe *)psVar13);
            psVar30 = (secp256k1_gej *)(auStack_a98 + 0x30);
            psStack_ab0 = (secp256k1_gej *)0x119fc8;
            secp256k1_fe_sqr(&psVar18->x,(secp256k1_fe *)psVar30);
            psStack_ab0 = (secp256k1_gej *)0x119fd0;
            secp256k1_fe_verify(&psVar18->x);
            psStack_ab0 = (secp256k1_gej *)0x119fd8;
            psVar29 = psVar14;
            secp256k1_fe_verify((secp256k1_fe *)psVar14);
            iVar6 = auStack_a98._40_4_ + (psVar18->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011a2a7;
            uVar22 = (psVar18->x).n[1];
            uVar3 = (psVar18->x).n[2];
            uVar4 = (psVar18->x).n[3];
            (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_a98._0_8_;
            (psVar18->x).n[1] = uVar22 + auStack_a98._8_8_;
            (psVar18->x).n[2] = uVar3 + auStack_a98._16_8_;
            (psVar18->x).n[3] = uVar4 + auStack_a98._24_8_;
            puVar1 = (psVar18->x).n + 4;
            *puVar1 = *puVar1 + auStack_a98._32_8_;
            (psVar18->x).magnitude = iVar6;
            (psVar18->x).normalized = 0;
            psStack_ab0 = (secp256k1_gej *)0x11a022;
            secp256k1_fe_verify(&psVar18->x);
            psStack_ab0 = (secp256k1_gej *)0x11a02a;
            secp256k1_fe_verify(&psVar18->x);
            psVar13 = (secp256k1_gej *)auStack_9d8;
            psStack_ab0 = (secp256k1_gej *)0x11a03a;
            psVar29 = psVar13;
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            iVar6 = auStack_9d8._40_4_ + (psVar18->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011a2ac;
            uVar22 = (psVar18->x).n[1];
            uVar3 = (psVar18->x).n[2];
            uVar4 = (psVar18->x).n[3];
            psVar13 = (secp256k1_gej *)auStack_9d8;
            (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_9d8._0_8_;
            (psVar18->x).n[1] = uVar22 + auStack_9d8._8_8_;
            (psVar18->x).n[2] = uVar3 + auStack_9d8._16_8_;
            (psVar18->x).n[3] = uVar4 + auStack_9d8._24_8_;
            puVar1 = (psVar18->x).n + 4;
            *puVar1 = *puVar1 + auStack_9d8._32_8_;
            (psVar18->x).magnitude = iVar6;
            (psVar18->x).normalized = 0;
            psStack_ab0 = (secp256k1_gej *)0x11a089;
            secp256k1_fe_verify(&psVar18->x);
            psStack_ab0 = (secp256k1_gej *)0x11a091;
            secp256k1_fe_verify(&psVar18->x);
            psStack_ab0 = (secp256k1_gej *)0x11a099;
            psVar29 = psVar13;
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            iVar6 = auStack_9d8._40_4_ + (psVar18->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011a2b1;
            uVar22 = (psVar18->x).n[1];
            uVar3 = (psVar18->x).n[2];
            uVar4 = (psVar18->x).n[3];
            psVar13 = (secp256k1_gej *)auStack_9d8;
            (psVar18->x).n[0] = (psVar18->x).n[0] + auStack_9d8._0_8_;
            (psVar18->x).n[1] = uVar22 + auStack_9d8._8_8_;
            (psVar18->x).n[2] = uVar3 + auStack_9d8._16_8_;
            (psVar18->x).n[3] = uVar4 + auStack_9d8._24_8_;
            puVar1 = (psVar18->x).n + 4;
            *puVar1 = *puVar1 + auStack_9d8._32_8_;
            (psVar18->x).magnitude = iVar6;
            (psVar18->x).normalized = 0;
            psStack_ab0 = (secp256k1_gej *)0x11a0e8;
            secp256k1_fe_verify(&psVar18->x);
            psStack_ab0 = (secp256k1_gej *)0x11a0f0;
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            psStack_ab0 = (secp256k1_gej *)0x11a0f8;
            psVar29 = psVar18;
            secp256k1_fe_verify(&psVar18->x);
            iVar6 = (psVar18->x).magnitude + auStack_9d8._40_4_;
            if (iVar6 < 0x21) {
              auStack_9d8._0_8_ = (psVar18->x).n[0] + auStack_9d8._0_8_;
              auStack_9d8._8_8_ = (psVar18->x).n[1] + auStack_9d8._8_8_;
              auStack_9d8._16_8_ = (psVar18->x).n[2] + auStack_9d8._16_8_;
              auStack_9d8._24_8_ = (psVar18->x).n[3] + auStack_9d8._24_8_;
              auStack_9d8._32_8_ = auStack_9d8._32_8_ + (psVar18->x).n[4];
              auStack_9d8._44_4_ = 0;
              psStack_ab0 = (secp256k1_gej *)0x11a14b;
              auStack_9d8._40_4_ = iVar6;
              secp256k1_fe_verify((secp256k1_fe *)auStack_9d8);
              psVar13 = (secp256k1_gej *)&psVar18->y;
              psStack_ab0 = (secp256k1_gej *)0x11a15f;
              secp256k1_fe_mul((secp256k1_fe *)psVar13,(secp256k1_fe *)auStack_9d8,
                               (secp256k1_fe *)(auStack_a98 + 0x30));
              psVar19 = (secp256k1_gej *)auStack_a98;
              psStack_ab0 = (secp256k1_gej *)0x11a174;
              psVar30 = psVar19;
              secp256k1_fe_mul((secp256k1_fe *)psVar19,(secp256k1_fe *)psVar19,
                               (secp256k1_fe *)auStack_a38);
              psStack_ab0 = (secp256k1_gej *)0x11a17c;
              secp256k1_fe_verify((secp256k1_fe *)psVar13);
              psStack_ab0 = (secp256k1_gej *)0x11a184;
              psVar29 = psVar19;
              secp256k1_fe_verify((secp256k1_fe *)psVar19);
              iVar6 = auStack_a98._40_4_ + (psVar18->y).magnitude;
              if (iVar6 < 0x21) {
                uVar22 = (psVar18->y).n[1];
                uVar3 = (psVar18->y).n[2];
                uVar4 = (psVar18->y).n[3];
                (psVar18->y).n[0] = (psVar18->y).n[0] + auStack_a98._0_8_;
                (psVar18->y).n[1] = uVar22 + auStack_a98._8_8_;
                (psVar18->y).n[2] = uVar3 + auStack_a98._16_8_;
                (psVar18->y).n[3] = uVar4 + auStack_a98._24_8_;
                puVar1 = (psVar18->y).n + 4;
                *puVar1 = *puVar1 + auStack_a98._32_8_;
                (psVar18->y).magnitude = iVar6;
                (psVar18->y).normalized = 0;
                goto LAB_00119b7e;
              }
              goto LAB_0011a2bb;
            }
          }
          else {
            psStack_ab0 = (secp256k1_gej *)0x11a2a2;
            secp256k1_gej_add_zinv_var_cold_7();
LAB_0011a2a2:
            psStack_ab0 = (secp256k1_gej *)0x11a2a7;
            secp256k1_gej_add_zinv_var_cold_6();
LAB_0011a2a7:
            psStack_ab0 = (secp256k1_gej *)0x11a2ac;
            secp256k1_gej_add_zinv_var_cold_5();
LAB_0011a2ac:
            psStack_ab0 = (secp256k1_gej *)0x11a2b1;
            secp256k1_gej_add_zinv_var_cold_4();
LAB_0011a2b1:
            psStack_ab0 = (secp256k1_gej *)0x11a2b6;
            secp256k1_gej_add_zinv_var_cold_3();
          }
          psStack_ab0 = (secp256k1_gej *)0x11a2bb;
          secp256k1_gej_add_zinv_var_cold_2();
LAB_0011a2bb:
          psStack_ab0 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
          secp256k1_gej_add_zinv_var_cold_1();
          psStack_ad0 = psVar18;
          psStack_ac8 = psVar14;
          psStack_ac0 = psVar28;
          psStack_ab8 = psVar13;
          psStack_ab0 = psVar19;
          secp256k1_gej_verify(psVar30);
          psVar27 = a_05;
          secp256k1_fe_verify(&a_05->x);
          if (psVar30->infinity == 0) {
            secp256k1_fe_sqr(&sStack_b00,&a_05->x);
            secp256k1_fe_mul(&sStack_b30,&sStack_b00,&a_05->x);
            secp256k1_fe_mul(&psVar29->x,&psVar30->x,&sStack_b00);
            secp256k1_fe_mul(&psVar29->y,&psVar30->y,&sStack_b30);
            *(int *)(psVar29->z).n = psVar30->infinity;
            secp256k1_ge_verify((secp256k1_ge *)psVar29);
            return;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          psVar27->infinity = 1;
          (psVar27->x).magnitude = 0;
          (psVar27->x).normalized = 1;
          (psVar27->x).n[0] = 0;
          (psVar27->x).n[1] = 0;
          (psVar27->x).n[2] = 0;
          (psVar27->x).n[3] = 0;
          (psVar27->x).n[4] = 0;
          secp256k1_fe_verify(&psVar27->x);
          (psVar27->y).magnitude = 0;
          (psVar27->y).normalized = 1;
          (psVar27->y).n[0] = 0;
          (psVar27->y).n[1] = 0;
          (psVar27->y).n[2] = 0;
          (psVar27->y).n[3] = 0;
          (psVar27->y).n[4] = 0;
          secp256k1_fe_verify(&psVar27->y);
          secp256k1_ge_verify(psVar27);
          return;
        }
        psVar28 = (secp256k1_fe *)(sStack_828.z.n + 1);
        psStack_840 = (secp256k1_gej *)0x119971;
        secp256k1_fe_sqr(psVar28,&sStack_828.x);
        psStack_840 = (secp256k1_gej *)0x119981;
        secp256k1_fe_mul((secp256k1_fe *)(sStack_828.y.n + 1),psVar28,&sStack_828.x);
        psStack_840 = (secp256k1_gej *)0x11998f;
        secp256k1_fe_mul(&psVar27->x,&psVar27->x,psVar28);
        psVar13 = (secp256k1_gej *)&psVar27->y;
        psStack_840 = (secp256k1_gej *)0x1199a1;
        secp256k1_fe_mul((secp256k1_fe *)psVar13,(secp256k1_fe *)psVar13,
                         (secp256k1_fe *)(sStack_828.y.n + 1));
        psStack_840 = (secp256k1_gej *)0x1199a9;
        secp256k1_ge_verify(psVar27);
        uVar22 = uVar22 + 1;
        psVar27 = psVar27 + -1;
        psVar18 = psStack_838;
      } while (puStack_830 != (undefined1 *)uVar22);
    }
    do {
      psStack_840 = (secp256k1_gej *)0x1199cb;
      secp256k1_ge_verify((secp256k1_ge *)a_06);
      a_06 = (secp256k1_gej *)((a_06->z).n + 1);
      psVar13 = psVar18 + -1;
      psVar18 = (secp256k1_gej *)&psVar13->field_0x97;
    } while (&psVar13->field_0x97 != (undefined1 *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}